

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

Curl_addrinfo * Curl_doh(Curl_easy *data,char *hostname,int port,int *waitp)

{
  connectdata *pcVar1;
  _Bool _Var2;
  CURLcode CVar3;
  dohdata *pdVar4;
  curl_slist *pcVar5;
  connectdata *conn;
  dohdata *dohp;
  int slot;
  CURLcode result;
  int *waitp_local;
  int port_local;
  char *hostname_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  *waitp = 0;
  pdVar4 = (dohdata *)(*Curl_ccalloc)(1,0x488);
  (data->req).doh = pdVar4;
  if (pdVar4 == (dohdata *)0x0) {
    return (Curl_addrinfo *)0x0;
  }
  pcVar1->bits = (ConnectBits)((uint)pcVar1->bits & 0xfbffffff | 0x4000000);
  pdVar4->host = hostname;
  pdVar4->port = port;
  pcVar5 = curl_slist_append((curl_slist *)0x0,"Content-Type: application/dns-message");
  pdVar4->headers = pcVar5;
  if ((pdVar4->headers == (curl_slist *)0x0) ||
     (CVar3 = dohprobe(data,pdVar4->probe,DNS_TYPE_A,hostname,(data->set).str[0x43],data->multi,
                       pdVar4->headers), CVar3 != CURLE_OK)) {
LAB_00ae3643:
    curl_slist_free_all(pdVar4->headers);
    ((data->req).doh)->headers = (curl_slist *)0x0;
    for (dohp._0_4_ = 0; (int)dohp < 2; dohp._0_4_ = (int)dohp + 1) {
      curl_multi_remove_handle(data->multi,pdVar4->probe[(int)dohp].easy);
      Curl_close(&pdVar4->probe[(int)dohp].easy);
    }
    (*Curl_cfree)((data->req).doh);
    (data->req).doh = (dohdata *)0x0;
  }
  else {
    pdVar4->pending = pdVar4->pending + 1;
    if ((pcVar1->ip_version != '\x01') && (_Var2 = Curl_ipv6works(data), _Var2)) {
      CVar3 = dohprobe(data,pdVar4->probe + 1,DNS_TYPE_AAAA,hostname,(data->set).str[0x43],
                       data->multi,pdVar4->headers);
      if (CVar3 != CURLE_OK) goto LAB_00ae3643;
      pdVar4->pending = pdVar4->pending + 1;
    }
    *waitp = 1;
  }
  return (Curl_addrinfo *)0x0;
}

Assistant:

struct Curl_addrinfo *Curl_doh(struct Curl_easy *data,
                               const char *hostname,
                               int port,
                               int *waitp)
{
  CURLcode result = CURLE_OK;
  int slot;
  struct dohdata *dohp;
  struct connectdata *conn = data->conn;
  *waitp = FALSE;
  (void)hostname;
  (void)port;

  DEBUGASSERT(!data->req.doh);
  DEBUGASSERT(conn);

  /* start clean, consider allocating this struct on demand */
  dohp = data->req.doh = calloc(1, sizeof(struct dohdata));
  if(!dohp)
    return NULL;

  conn->bits.doh = TRUE;
  dohp->host = hostname;
  dohp->port = port;
  dohp->headers =
    curl_slist_append(NULL,
                      "Content-Type: application/dns-message");
  if(!dohp->headers)
    goto error;

  /* create IPv4 DoH request */
  result = dohprobe(data, &dohp->probe[DOH_PROBE_SLOT_IPADDR_V4],
                    DNS_TYPE_A, hostname, data->set.str[STRING_DOH],
                    data->multi, dohp->headers);
  if(result)
    goto error;
  dohp->pending++;

#ifdef ENABLE_IPV6
  if((conn->ip_version != CURL_IPRESOLVE_V4) && Curl_ipv6works(data)) {
    /* create IPv6 DoH request */
    result = dohprobe(data, &dohp->probe[DOH_PROBE_SLOT_IPADDR_V6],
                      DNS_TYPE_AAAA, hostname, data->set.str[STRING_DOH],
                      data->multi, dohp->headers);
    if(result)
      goto error;
    dohp->pending++;
  }
#endif
  *waitp = TRUE; /* this never returns synchronously */
  return NULL;

error:
  curl_slist_free_all(dohp->headers);
  data->req.doh->headers = NULL;
  for(slot = 0; slot < DOH_PROBE_SLOTS; slot++) {
    (void)curl_multi_remove_handle(data->multi, dohp->probe[slot].easy);
    Curl_close(&dohp->probe[slot].easy);
  }
  Curl_safefree(data->req.doh);
  return NULL;
}